

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# elf-tool.cc
# Opt level: O3

int main(int argc,char **argv)

{
  pointer pbVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  uint abbrev;
  byte bVar3;
  size_type sVar4;
  pointer pbVar5;
  pointer pbVar6;
  bool bVar7;
  bool bVar8;
  int iVar9;
  int iVar10;
  char *pcVar11;
  typed_value<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_char>
  *ptVar12;
  typed_value<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_char>
  *ptVar13;
  typed_value<unsigned_int,_char> *ptVar14;
  const_iterator cVar15;
  size_t sVar16;
  long *plVar17;
  void *pvVar18;
  void *pvVar19;
  any *paVar20;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar21;
  uint *puVar22;
  ostream *poVar23;
  pointer psVar24;
  long lVar25;
  self_type *psVar26;
  ulong uVar27;
  int *piVar28;
  size_type __n;
  string hash;
  uint64_t str_room;
  string str;
  Elf_parser elf_parser;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  input;
  uint64_t str_offset;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> __str;
  string s;
  string_parser sp;
  map map;
  positional_options_description popt;
  options_description optdesc;
  char usage_banner [52];
  sha sha;
  string *local_370;
  string local_368;
  ulong local_348;
  int local_33c;
  string local_338;
  pointer local_318;
  undefined1 local_310 [40];
  _Alloc_hider local_2e8;
  size_type local_2e0;
  char local_2d8 [16];
  bool local_2c8;
  function1<std::vector<boost::program_options::basic_option<char>,_std::allocator<boost::program_options::basic_option<char>_>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_&>
  local_2c0 [32];
  options_description *local_2a0;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_298;
  _Base_ptr local_280;
  uint64_t local_278;
  undefined1 *local_270;
  long local_268;
  undefined1 local_260 [16];
  char *local_250;
  ulong local_248;
  char local_240 [16];
  string_parser local_230;
  string *local_1e8;
  pointer local_1e0;
  _Base_ptr local_1d8;
  basic_ptree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_1d0;
  vector<elf_parser::section_t,_std::allocator<elf_parser::section_t>_> local_1a8;
  path_type local_190;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_160;
  undefined1 *local_148;
  undefined1 local_138 [16];
  undefined1 *local_128 [2];
  undefined1 local_118 [24];
  vector<boost::shared_ptr<boost::program_options::option_description>,_std::allocator<boost::shared_ptr<boost::program_options::option_description>_>_>
  local_100 [24];
  void *local_e8;
  undefined4 local_e0;
  undefined8 local_d8;
  undefined4 local_d0;
  undefined8 local_c8;
  vector<boost::shared_ptr<boost::program_options::options_description>,_std::allocator<boost::shared_ptr<boost::program_options::options_description>_>_>
  local_c0 [24];
  char local_a8 [52];
  sha local_74;
  
  local_298.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (string *)0x0;
  local_298.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (string *)0x0;
  local_298.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  pbVar1 = (pointer)(local_310 + 0x10);
  local_310._0_8_ = pbVar1;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_310,
             "sshash-elf -- tool for processing sshash stings in ELF files\nUsage: sshash-elf <--hashmap map> [options] [elf-input-files]\nOptions"
             ,"");
  boost::program_options::options_description::options_description
            ((options_description *)local_128,(string *)local_310,
             (uint)boost::program_options::options_description::m_default_line_length,
             (uint)boost::program_options::options_description::m_default_line_length >> 1);
  if ((pointer)local_310._0_8_ != pbVar1) {
    operator_delete((void *)local_310._0_8_);
  }
  local_310._0_8_ = boost::program_options::options_description::add_options();
  pcVar11 = (char *)boost::program_options::options_description_easy_init::operator()
                              (local_310,"help");
  ptVar12 = boost::program_options::
            value<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>
                      (&local_298);
  ptVar12->m_composing = true;
  pcVar11 = (char *)boost::program_options::options_description_easy_init::operator()
                              (pcVar11,(value_semantic *)"input",(char *)ptVar12);
  ptVar13 = boost::program_options::value<std::__cxx11::string>
                      ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  pcVar11 = (char *)boost::program_options::options_description_easy_init::operator()
                              (pcVar11,(value_semantic *)"hashmap,m",(char *)ptVar13);
  ptVar14 = boost::program_options::value<unsigned_int>((uint *)0x0);
  local_230._fd = 8;
  ptVar14 = boost::program_options::typed_value<unsigned_int,_char>::default_value
                      (ptVar14,(uint *)&local_230);
  pcVar11 = (char *)boost::program_options::options_description_easy_init::operator()
                              (pcVar11,(value_semantic *)"minlen,L",(char *)ptVar14);
  pcVar11 = (char *)boost::program_options::options_description_easy_init::operator()
                              (pcVar11,"dryrun");
  boost::program_options::options_description_easy_init::operator()(pcVar11,"verbose");
  boost::program_options::positional_options_description::positional_options_description
            ((positional_options_description *)&local_160);
  boost::program_options::positional_options_description::add((char *)&local_160,0x1170bb);
  boost::program_options::basic_command_line_parser<char>::basic_command_line_parser
            ((basic_command_line_parser<char> *)local_310,argc,argv);
  boost::program_options::detail::cmdline::set_options_description((options_description *)local_310)
  ;
  local_2a0 = (options_description *)local_128;
  boost::program_options::detail::cmdline::set_positional_options
            ((positional_options_description *)local_310);
  boost::program_options::basic_command_line_parser<char>::run
            ((basic_parsed_options<char> *)&local_230,(basic_command_line_parser<char> *)local_310);
  boost::program_options::store((basic_parsed_options *)&local_230,(variables_map *)optmap,false);
  std::
  vector<boost::program_options::basic_option<char>,_std::allocator<boost::program_options::basic_option<char>_>_>
  ::~vector((vector<boost::program_options::basic_option<char>,_std::allocator<boost::program_options::basic_option<char>_>_>
             *)&local_230);
  boost::
  function1<std::vector<boost::program_options::basic_option<char>,_std::allocator<boost::program_options::basic_option<char>_>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_&>
  ::~function1(local_2c0);
  boost::
  function1<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
  ::~function1((function1<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
                *)&local_2e0);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)local_310);
  boost::program_options::notify((variables_map *)optmap);
  local_310._0_8_ = pbVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_310,"help","");
  cVar15 = std::
           _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value>_>_>
           ::find((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value>_>_>
                   *)(optmap + 0x10),(key_type *)local_310);
  pbVar6 = local_298.
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  pbVar5 = local_298.
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  if (cVar15._M_node == (_Base_ptr)(optmap + 0x18)) {
    if ((pointer)local_310._0_8_ != pbVar1) {
      operator_delete((void *)local_310._0_8_);
    }
    if (pbVar5 != pbVar6) {
      local_310._0_8_ = pbVar1;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_310,"verbose","");
      local_280 = (_Base_ptr)
                  std::
                  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value>_>_>
                  ::find((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value>_>_>
                          *)(optmap + 0x10),(key_type *)local_310);
      if ((pointer)local_310._0_8_ != pbVar1) {
        operator_delete((void *)local_310._0_8_);
      }
      local_310._0_8_ = pbVar1;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_310,"dryrun","");
      local_1d8 = (_Base_ptr)
                  std::
                  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value>_>_>
                  ::find((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value>_>_>
                          *)(optmap + 0x10),(key_type *)local_310);
      if ((pointer)local_310._0_8_ != pbVar1) {
        operator_delete((void *)local_310._0_8_);
      }
      builtin_strncpy(local_a8,"usage: sshash-tool [<elf_file>] [<ssiMapFilename>]\n",0x34);
      if (argc < 3) {
        sVar16 = strlen(local_a8);
        iVar9 = -1;
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,local_a8,sVar16);
      }
      else {
        local_1d0.m_data._M_dataplus._M_p = (pointer)&local_1d0.m_data.field_2;
        local_1d0.m_data._M_string_length = 0;
        local_1d0.m_data.field_2._M_local_buf[0] = '\0';
        pvVar18 = operator_new(0x20);
        pvVar19 = operator_new(0x70);
        *(void **)((long)pvVar18 + 8) = pvVar19;
        *(undefined8 *)((long)pvVar19 + 0x48) = 0;
        *(long *)((long)pvVar19 + 0x50) = (long)pvVar19 + 0x48;
        *(long *)((long)pvVar19 + 0x58) = (long)pvVar19 + 0x48;
        *(long *)((long)pvVar19 + 0x68) = (long)pvVar19 + 0x60;
        *(long *)((long)pvVar19 + 0x60) = (long)pvVar19 + 0x60;
        *(undefined8 *)((long)pvVar18 + 0x18) = 0;
        local_310._0_8_ = pbVar1;
        local_1d0.m_children = pvVar18;
        std::__cxx11::string::_M_construct<char_const*>((string *)local_310,"hashmap","");
        paVar20 = (any *)boost::program_options::abstract_variables_map::operator[]
                                   ((string *)optmap);
        pbVar21 = boost::any_cast<std::__cxx11::string_const&>(paVar20);
        sshash::map::load((map *)&local_1d0,pbVar21,true);
        if ((pointer)local_310._0_8_ != pbVar1) {
          operator_delete((void *)local_310._0_8_);
        }
        local_310._0_8_ = pbVar1;
        std::__cxx11::string::_M_construct<char_const*>((string *)local_310,"minlen","");
        paVar20 = (any *)boost::program_options::abstract_variables_map::operator[]
                                   ((string *)optmap);
        puVar22 = boost::any_cast<unsigned_int_const&>(paVar20);
        abbrev = *puVar22;
        if ((pointer)local_310._0_8_ != pbVar1) {
          operator_delete((void *)local_310._0_8_);
        }
        sshash::sha::sha(&local_74,abbrev);
        local_370 = local_298.
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start;
        local_1e8 = local_298.
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_finish;
        if (local_298.
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_start !=
            local_298.
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_finish) {
          do {
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)&std::cout,"processing ",0xb);
            poVar23 = std::__ostream_insert<char,std::char_traits<char>>
                                ((ostream *)&std::cout,(local_370->_M_dataplus)._M_p,
                                 local_370->_M_string_length);
            std::__ostream_insert<char,std::char_traits<char>>(poVar23,"\n",1);
            ::elf_parser::Elf_parser::Elf_parser((Elf_parser *)local_310,local_370);
            pcVar11 = (local_370->_M_dataplus)._M_p;
            if (local_2c8 == true) {
              poVar23 = std::__ostream_insert<char,std::char_traits<char>>
                                  ((ostream *)&std::cerr,pcVar11,local_370->_M_string_length);
              std::__ostream_insert<char,std::char_traits<char>>(poVar23,": readelf failed: ",0x12);
              poVar23 = std::__ostream_insert<char,std::char_traits<char>>
                                  (poVar23,local_2e8._M_p,local_2e0);
              bVar3 = 1;
              std::__ostream_insert<char,std::char_traits<char>>(poVar23,"\n",1);
            }
            else {
              iVar9 = open(pcVar11,2);
              if (iVar9 < 0) {
                poVar23 = std::__ostream_insert<char,std::char_traits<char>>
                                    ((ostream *)&std::cerr,(local_370->_M_dataplus)._M_p,
                                     local_370->_M_string_length);
                std::__ostream_insert<char,std::char_traits<char>>(poVar23," open failed: ",0xe);
                piVar28 = __errno_location();
                pcVar11 = strerror(*piVar28);
                if (pcVar11 == (char *)0x0) {
                  std::ios::clear((int)poVar23 + (int)*(undefined8 *)(*(long *)poVar23 + -0x18));
                }
                else {
                  sVar16 = strlen(pcVar11);
                  std::__ostream_insert<char,std::char_traits<char>>(poVar23,pcVar11,sVar16);
                }
                bVar3 = 1;
                std::__ostream_insert<char,std::char_traits<char>>(poVar23,"\n",1);
              }
              else {
                ::elf_parser::Elf_parser::get_sections(&local_1a8,(Elf_parser *)local_310);
                local_1e0 = local_1a8.
                            super__Vector_base<elf_parser::section_t,_std::allocator<elf_parser::section_t>_>
                            ._M_impl.super__Vector_impl_data._M_finish;
                if (local_1a8.
                    super__Vector_base<elf_parser::section_t,_std::allocator<elf_parser::section_t>_>
                    ._M_impl.super__Vector_impl_data._M_start ==
                    local_1a8.
                    super__Vector_base<elf_parser::section_t,_std::allocator<elf_parser::section_t>_>
                    ._M_impl.super__Vector_impl_data._M_finish) {
                  bVar7 = true;
                }
                else {
                  local_33c = 0;
                  psVar24 = local_1a8.
                            super__Vector_base<elf_parser::section_t,_std::allocator<elf_parser::section_t>_>
                            ._M_impl.super__Vector_impl_data._M_start;
                  do {
                    local_318 = psVar24;
                    lVar25 = std::__cxx11::string::find((char *)&psVar24->section_name,0x1171f1,0);
                    if (lVar25 != -1) {
                      std::__ostream_insert<char,std::char_traits<char>>
                                ((ostream *)&std::cout,"processing section: ",0x14);
                      poVar23 = std::__ostream_insert<char,std::char_traits<char>>
                                          ((ostream *)&std::cout,
                                           (local_318->section_name)._M_dataplus._M_p,
                                           (local_318->section_name)._M_string_length);
                      std::__ostream_insert<char,std::char_traits<char>>(poVar23,"\n",1);
                      local_230._start = (uint64_t)(uint)local_318->section_offset;
                      local_230._size = (uint64_t)(uint)local_318->section_size;
                      local_230._str._M_dataplus._M_p = (pointer)&local_230._str.field_2;
                      local_230._str._M_string_length = 0;
                      local_230._str.field_2._M_local_buf[0] = '\0';
                      local_230._end = local_230._size + local_230._start;
                      local_338._M_dataplus._M_p = (pointer)&local_338.field_2;
                      local_338._M_string_length = 0;
                      local_338.field_2._M_local_buf[0] = '\0';
                      local_230._fd = iVar9;
                      local_230._offset = local_230._start;
                      while( true ) {
                        bVar7 = string_parser::next(&local_230,&local_338,&local_278,&local_348);
                        if (!bVar7) break;
                        if (local_280 != (_Base_ptr)(optmap + 0x18)) {
                          std::__ostream_insert<char,std::char_traits<char>>
                                    ((ostream *)&std::cout,"string:",7);
                          *(uint *)(boost::program_options::positional_options_description::
                                    positional_options_description + *(long *)(std::cout + -0x18)) =
                               *(uint *)(boost::program_options::positional_options_description::
                                         positional_options_description +
                                        *(long *)(std::cout + -0x18)) & 0xffffffb5 | 8;
                          std::__ostream_insert<char,std::char_traits<char>>
                                    ((ostream *)&std::cout," offset: ",9);
                          poVar23 = std::ostream::_M_insert<unsigned_long>((ulong)&std::cout);
                          *(uint *)(poVar23 + *(long *)(*(long *)poVar23 + -0x18) + 0x18) =
                               *(uint *)(poVar23 + *(long *)(*(long *)poVar23 + -0x18) + 0x18) &
                               0xffffffb5 | 2;
                          std::__ostream_insert<char,std::char_traits<char>>(poVar23," room: ",7);
                          poVar23 = std::ostream::_M_insert<unsigned_long>((ulong)poVar23);
                          std::__ostream_insert<char,std::char_traits<char>>(poVar23," [",2);
                          poVar23 = std::__ostream_insert<char,std::char_traits<char>>
                                              (poVar23,local_338._M_dataplus._M_p,
                                               local_338._M_string_length);
                          std::__ostream_insert<char,std::char_traits<char>>(poVar23,"]\n",2);
                        }
                        if (local_348 < local_74._abbrev) {
                          std::__ostream_insert<char,std::char_traits<char>>
                                    ((ostream *)&std::cerr,
                                     " not enough room for digest. missing pad???\n",0x2c);
                          break;
                        }
                        local_368._M_string_length = 0;
                        local_368.field_2._M_local_buf[0] = '\0';
                        local_368._M_dataplus._M_p = (pointer)&local_368.field_2;
                        sshash::sha::digest(&local_74,&local_368,local_338._M_dataplus._M_p,
                                            (uint)local_338._M_string_length);
                        if (local_280 != (_Base_ptr)(optmap + 0x18)) {
                          std::__ostream_insert<char,std::char_traits<char>>
                                    ((ostream *)&std::cout,"digest: ",8);
                          poVar23 = std::__ostream_insert<char,std::char_traits<char>>
                                              ((ostream *)&std::cout,local_368._M_dataplus._M_p,
                                               local_368._M_string_length);
                          std::__ostream_insert<char,std::char_traits<char>>(poVar23," [",2);
                          poVar23 = std::__ostream_insert<char,std::char_traits<char>>
                                              (poVar23,local_338._M_dataplus._M_p,
                                               local_338._M_string_length);
                          std::__ostream_insert<char,std::char_traits<char>>(poVar23,"]\n",2);
                        }
                        bVar8 = sshash::map::update((map *)&local_1d0,&local_368,&local_338,
                                                    local_370);
                        if (!bVar8) {
                          local_270 = local_260;
                          std::__cxx11::string::_M_construct<char*>
                                    ((string *)&local_270,local_368._M_dataplus._M_p,
                                     local_368._M_dataplus._M_p + local_368._M_string_length);
                          std::__cxx11::string::append((char *)&local_270);
                          paVar2 = &local_190.m_value.field_2;
                          local_190.m_value._M_dataplus._M_p = (pointer)paVar2;
                          std::__cxx11::string::_M_construct<char*>
                                    ((string *)&local_190,local_270,local_270 + local_268);
                          local_190.m_separator = '.';
                          local_190.m_start._M_current = local_190.m_value._M_dataplus._M_p;
                          psVar26 = boost::property_tree::
                                    basic_ptree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                    ::get_child(&local_1d0,&local_190);
                          boost::property_tree::
                          basic_ptree<std::__cxx11::string,std::__cxx11::string,std::less<std::__cxx11::string>>
                          ::
                          get_value<std::__cxx11::string,boost::property_tree::id_translator<std::__cxx11::string>>
                                    (&local_250,
                                     (basic_ptree<std::__cxx11::string,std::__cxx11::string,std::less<std::__cxx11::string>>
                                      *)psVar26);
                          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                               *)local_190.m_value._M_dataplus._M_p != paVar2) {
                            operator_delete(local_190.m_value._M_dataplus._M_p);
                          }
                          if (local_270 != local_260) {
                            operator_delete(local_270);
                          }
                          uVar27 = local_248;
                          pcVar11 = local_250;
                          sVar4 = local_338._M_string_length;
                          __n = local_248;
                          if (local_338._M_string_length < local_248) {
                            __n = local_338._M_string_length;
                          }
                          if (__n == 0) {
                            if (local_248 == local_338._M_string_length) goto LAB_00107445;
                          }
                          else {
                            iVar10 = bcmp(local_250,local_338._M_dataplus._M_p,__n);
                            if ((uVar27 == sVar4) && (iVar10 == 0)) {
LAB_00107445:
                              if (pcVar11 != local_240) {
                                operator_delete(pcVar11);
                              }
                              goto LAB_00107462;
                            }
                          }
                          poVar23 = std::__ostream_insert<char,std::char_traits<char>>
                                              ((ostream *)&std::cerr,(local_370->_M_dataplus)._M_p,
                                               local_370->_M_string_length);
                          std::__ostream_insert<char,std::char_traits<char>>
                                    (poVar23,": hash collision: ",0x12);
                          poVar23 = std::__ostream_insert<char,std::char_traits<char>>
                                              (poVar23,local_368._M_dataplus._M_p,
                                               local_368._M_string_length);
                          std::__ostream_insert<char,std::char_traits<char>>(poVar23," [",2);
                          poVar23 = std::__ostream_insert<char,std::char_traits<char>>
                                              (poVar23,local_338._M_dataplus._M_p,
                                               local_338._M_string_length);
                          std::__ostream_insert<char,std::char_traits<char>>(poVar23,"] [",3);
                          poVar23 = std::__ostream_insert<char,std::char_traits<char>>
                                              (poVar23,local_250,local_248);
                          std::__ostream_insert<char,std::char_traits<char>>(poVar23,"]\n",2);
                          if (local_250 != local_240) {
                            operator_delete(local_250);
                          }
LAB_0010763f:
                          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                               *)local_368._M_dataplus._M_p != &local_368.field_2) {
                            operator_delete(local_368._M_dataplus._M_p);
                          }
                          break;
                        }
LAB_00107462:
                        if (local_1d8 == (_Base_ptr)(optmap + 0x18)) {
                          std::__cxx11::string::resize((ulong)&local_368,(char)local_348);
                          uVar27 = pwrite(iVar9,local_368._M_dataplus._M_p,local_348,local_278);
                          if (uVar27 != local_348) {
                            poVar23 = std::__ostream_insert<char,std::char_traits<char>>
                                                ((ostream *)&std::cerr,(local_370->_M_dataplus)._M_p
                                                 ,local_370->_M_string_length);
                            std::__ostream_insert<char,std::char_traits<char>>
                                      (poVar23," write failed: ",0xf);
                            piVar28 = __errno_location();
                            pcVar11 = strerror(*piVar28);
                            if (pcVar11 == (char *)0x0) {
                              std::ios::clear((int)poVar23 +
                                              (int)*(undefined8 *)(*(long *)poVar23 + -0x18));
                            }
                            else {
                              sVar16 = strlen(pcVar11);
                              std::__ostream_insert<char,std::char_traits<char>>
                                        (poVar23,pcVar11,sVar16);
                            }
                            std::__ostream_insert<char,std::char_traits<char>>(poVar23,"\n",1);
                            goto LAB_0010763f;
                          }
                        }
                        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                             *)local_368._M_dataplus._M_p != &local_368.field_2) {
                          operator_delete(local_368._M_dataplus._M_p);
                        }
                      }
                      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                           *)local_338._M_dataplus._M_p != &local_338.field_2) {
                        operator_delete(local_338._M_dataplus._M_p);
                      }
                      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                           *)local_230._str._M_dataplus._M_p != &local_230._str.field_2) {
                        operator_delete(local_230._str._M_dataplus._M_p);
                      }
                      if (bVar7) {
                        bVar3 = 1;
                        goto LAB_00107768;
                      }
                      local_33c = local_33c + 1;
                    }
                    psVar24 = local_318 + 1;
                  } while (psVar24 != local_1e0);
                  bVar7 = local_33c == 0;
                }
                close(iVar9);
                if (bVar7) {
                  std::__ostream_insert<char,std::char_traits<char>>
                            ((ostream *)&std::cout,"warn: ",6);
                  poVar23 = std::__ostream_insert<char,std::char_traits<char>>
                                      ((ostream *)&std::cout,(local_370->_M_dataplus)._M_p,
                                       local_370->_M_string_length);
                  std::__ostream_insert<char,std::char_traits<char>>
                            (poVar23," : does not contain .sshash.str sections\n",0x29);
                }
                bVar3 = 0;
LAB_00107768:
                std::vector<elf_parser::section_t,_std::allocator<elf_parser::section_t>_>::~vector
                          (&local_1a8);
              }
            }
            if (local_2e8._M_p != local_2d8) {
              operator_delete(local_2e8._M_p);
            }
            if ((pointer)local_310._0_8_ != (pointer)(local_310 + 0x10)) {
              operator_delete((void *)local_310._0_8_);
            }
            local_370 = local_370 + 1;
          } while (!(bool)(bVar3 | local_370 == local_1e8));
        }
        local_310._0_8_ = (pointer)(local_310 + 0x10);
        std::__cxx11::string::_M_construct<char_const*>((string *)local_310,"hashmap","");
        paVar20 = (any *)boost::program_options::abstract_variables_map::operator[]
                                   ((string *)optmap);
        pbVar21 = boost::any_cast<std::__cxx11::string_const&>(paVar20);
        sshash::map::save((map *)&local_1d0,pbVar21);
        if ((pointer)local_310._0_8_ != (pointer)(local_310 + 0x10)) {
          operator_delete((void *)local_310._0_8_);
        }
        boost::property_tree::
        basic_ptree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~basic_ptree(&local_1d0);
        iVar9 = 0;
      }
      goto LAB_00106d78;
    }
  }
  else if ((pointer)local_310._0_8_ != pbVar1) {
    operator_delete((void *)local_310._0_8_);
  }
  plVar17 = (long *)boost::program_options::operator<<
                              ((ostream *)&std::cout,(options_description *)local_128);
  std::ios::widen((char)*(undefined8 *)(*plVar17 + -0x18) + (char)plVar17);
  std::ostream::put((char)plVar17);
  iVar9 = 1;
  std::ostream::flush();
LAB_00106d78:
  if (local_148 != local_138) {
    operator_delete(local_148);
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_160);
  std::
  vector<boost::shared_ptr<boost::program_options::options_description>,_std::allocator<boost::shared_ptr<boost::program_options::options_description>_>_>
  ::~vector(local_c0);
  if (local_e8 != (void *)0x0) {
    operator_delete(local_e8);
    local_e8 = (void *)0x0;
    local_e0 = 0;
    local_d8 = 0;
    local_d0 = 0;
    local_c8 = 0;
  }
  std::
  vector<boost::shared_ptr<boost::program_options::option_description>,_std::allocator<boost::shared_ptr<boost::program_options::option_description>_>_>
  ::~vector(local_100);
  if (local_128[0] != local_118) {
    operator_delete(local_128[0]);
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_298);
  return iVar9;
}

Assistant:

int main(int argc, char* argv[])
{
	std::vector<std::string> input;

	// **** Parse command line arguments ****
	po::options_description optdesc("sshash-elf -- tool for processing sshash stings in ELF files\n"
				"Usage: sshash-elf <--hashmap map> [options] [elf-input-files]\n"
				"Options");
	optdesc.add_options()
		("help", "Print this message")
		("input",     po::value<std::vector<std::string> >(&input)->composing(), "Input ELF file. Multiple files can be specified.")
		("hashmap,m", po::value<std::string>(), "Output hasmap file.")
		("minlen,L",  po::value<unsigned int>()->default_value(8), "Length of the hash value (aka min string length)")
		("dryrun",    "Generate hashmap file but do not modify input files")
		("verbose",   "Show verbose info (digest values, etc)");

	po::positional_options_description popt;
	popt.add("input", -1);

	po::store(po::command_line_parser(argc, argv).
	          options(optdesc).positional(popt).run(), optmap);

	po::notify(optmap);

	// ** All argument values (including the defaults) are now storred in 'optmap' **

	if (optmap.count("help") || input.empty()) {
		std::cout << optdesc << std::endl;
		return 1;
	}

	opt_verbose = optmap.count("verbose");
	opt_dryrun  = optmap.count("dryrun");

	char usage_banner[] = "usage: sshash-tool [<elf_file>] [<ssiMapFilename>]\n";
	if(argc < 3) {
		std::cerr << usage_banner;
		return -1;
	}

	sshash::map map;

	// Load map.
	// This may fail if the map doesn't exist yet.
	map.load(optmap["hashmap"].as<std::string>(), true /* optional */);

	// Init hash generator
	const unsigned int minlen = optmap["minlen"].as<unsigned int>();
	sshash::sha sha(minlen);

	// Process all inputs
	for (auto &i : input) {
		if (!elf_process(map, sha, i))
			break;
	}

	// Save updated map
	map.save(optmap["hashmap"].as<std::string>());
	return 0;
}